

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult GenValidUsageInputsXrPollEvent(XrInstance instance,XrEventDataBuffer *eventData)

{
  ValidateXrHandleResult VVar1;
  XrResult XVar2;
  GenValidUsageXrInstanceInfo *instance_info;
  XrResult XVar3;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *this;
  XrInstance_T *in_stack_fffffffffffffd98;
  string local_260;
  XrInstance instance_local;
  string local_238;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  string local_1f8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1d8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1c0;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1a8;
  ostringstream oss;
  
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  _oss = 1;
  instance_local = instance;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrInstance_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)
             &objects_info,&instance_local,(XrObjectType *)&oss);
  VVar1 = VerifyXrInstanceHandle(&instance_local);
  if (VVar1 == VALIDATE_XR_HANDLE_SUCCESS) {
    instance_info =
         HandleInfoBase<XrInstance_T_*,_GenValidUsageXrInstanceInfo>::get
                   (&g_instance_info.
                     super_HandleInfoBase<XrInstance_T_*,_GenValidUsageXrInstanceInfo>,
                    instance_local);
    if (eventData == (XrEventDataBuffer *)0x0) {
      std::__cxx11::string::string
                ((string *)&oss,"VUID-xrPollEvent-eventData-parameter",(allocator *)&local_1f8);
      std::__cxx11::string::string
                ((string *)&local_260,"xrPollEvent",(allocator *)&stack0xfffffffffffffd9f);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_1c0,&objects_info);
      std::__cxx11::string::string
                ((string *)&local_238,
                 "Invalid NULL for XrEventDataBuffer \"eventData\" which is not optional and must be non-NULL"
                 ,(allocator *)&stack0xfffffffffffffd9e);
      CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_260,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_1c0,&local_238);
      std::__cxx11::string::~string((string *)&local_238);
      this = &local_1c0;
    }
    else {
      std::__cxx11::string::string((string *)&oss,"xrPollEvent",(allocator *)&local_260);
      XVar3 = XR_SUCCESS;
      XVar2 = ValidateXrStruct(instance_info,(string *)&oss,&objects_info,false,true,eventData);
      std::__cxx11::string::~string((string *)&oss);
      if (XVar2 == XR_SUCCESS) goto LAB_001be13b;
      std::__cxx11::string::string
                ((string *)&oss,"VUID-xrPollEvent-eventData-parameter",(allocator *)&local_1f8);
      std::__cxx11::string::string
                ((string *)&local_260,"xrPollEvent",(allocator *)&stack0xfffffffffffffd9f);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_1d8,&objects_info);
      std::__cxx11::string::string
                ((string *)&local_238,"Command xrPollEvent param eventData is invalid",
                 (allocator *)&stack0xfffffffffffffd9e);
      CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_260,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_1d8,&local_238);
      std::__cxx11::string::~string((string *)&local_238);
      this = &local_1d8;
    }
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(this);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&oss);
    XVar3 = XR_ERROR_VALIDATION_FAILURE;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    std::operator<<((ostream *)&oss,"Invalid XrInstance handle \"instance\" ");
    HandleToHexString<XrInstance_T*>(in_stack_fffffffffffffd98);
    std::operator<<((ostream *)&oss,(string *)&local_260);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::string
              ((string *)&local_260,"VUID-xrPollEvent-instance-parameter",
               (allocator *)&stack0xfffffffffffffd9f);
    std::__cxx11::string::string
              ((string *)&local_238,"xrPollEvent",(allocator *)&stack0xfffffffffffffd9e);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1a8,&objects_info);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,&local_260,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_238,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1a8,&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1a8);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
    XVar3 = XR_ERROR_HANDLE_INVALID;
  }
LAB_001be13b:
  std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
  ~_Vector_base(&objects_info.
                 super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
               );
  return XVar3;
}

Assistant:

XrResult GenValidUsageInputsXrPollEvent(
XrInstance instance,
XrEventDataBuffer* eventData) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(instance, XR_OBJECT_TYPE_INSTANCE);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrInstanceHandle(&instance);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrInstance handle \"instance\" ";
                oss << HandleToHexString(instance);
                CoreValidLogMessage(nullptr, "VUID-xrPollEvent-instance-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrPollEvent",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        GenValidUsageXrInstanceInfo *gen_instance_info = g_instance_info.get(instance);
        (void)gen_instance_info;  // quiet warnings
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == eventData) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrPollEvent-eventData-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrPollEvent", objects_info,
                                "Invalid NULL for XrEventDataBuffer \"eventData\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Validate that the structure XrEventDataBuffer is valid
        xr_result = ValidateXrStruct(gen_instance_info, "xrPollEvent", objects_info,
                                                        false, true, eventData);
        if (XR_SUCCESS != xr_result) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrPollEvent-eventData-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrPollEvent",
                                objects_info,
                                "Command xrPollEvent param eventData is invalid");
            return xr_result;
        }
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}